

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

int * Pdr_ManSortByPriority(Pdr_Man_t *p,Pdr_Set_t *pCube)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  long lVar15;
  
  auVar6 = _DAT_0093d220;
  piVar4 = p->pOrder;
  iVar2 = pCube->nLits;
  uVar8 = (ulong)iVar2;
  if (0 < (long)uVar8) {
    piVar5 = p->vPrio->pArray;
    lVar15 = uVar8 - 1;
    auVar13._8_4_ = (int)lVar15;
    auVar13._0_8_ = lVar15;
    auVar13._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar10 = 0;
    auVar13 = auVar13 ^ _DAT_0093d220;
    auVar14 = _DAT_0093d210;
    do {
      auVar16 = auVar14 ^ auVar6;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        piVar4[uVar10] = (int)uVar10;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        piVar4[uVar10 + 1] = (int)uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
    } while ((iVar2 + 1U & 0xfffffffe) != uVar10);
    if (iVar2 != 1) {
      uVar11 = 1;
      uVar10 = 0;
      do {
        uVar1 = uVar10 + 1;
        uVar9 = uVar10 & 0xffffffff;
        uVar12 = uVar11;
        do {
          uVar7 = uVar12 & 0xffffffff;
          if (piVar5[*(int *)(&pCube->field_0x14 + (long)piVar4[(int)uVar9] * 4) >> 1] <=
              piVar5[*(int *)(&pCube->field_0x14 + (long)piVar4[uVar12] * 4) >> 1]) {
            uVar7 = uVar9;
          }
          uVar9 = uVar7;
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
        iVar3 = piVar4[uVar10];
        piVar4[uVar10] = piVar4[(int)uVar9];
        piVar4[(int)uVar9] = iVar3;
        uVar11 = uVar11 + 1;
        uVar10 = uVar1;
      } while (uVar1 != iVar2 - 1);
    }
  }
  return piVar4;
}

Assistant:

int * Pdr_ManSortByPriority( Pdr_Man_t * p, Pdr_Set_t * pCube )
{
    int * pPrios = Vec_IntArray(p->vPrio);
    int * pArray = p->pOrder;
    int temp, i, j, best_i, nSize = pCube->nLits;
    // initialize variable order
    for ( i = 0; i < nSize; i++ )
        pArray[i] = i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
//            if ( pArray[j] < pArray[best_i] )
            if ( pPrios[pCube->Lits[pArray[j]]>>1] < pPrios[pCube->Lits[pArray[best_i]]>>1] ) // list lower priority first (these will be removed first)
                best_i = j;
        temp = pArray[i];
        pArray[i] = pArray[best_i];
        pArray[best_i] = temp;
    }
/*
    for ( i = 0; i < pCube->nLits; i++ )
        Abc_Print( 1, "%2d : %5d    %5d  %5d\n", i, pArray[i], pCube->Lits[pArray[i]]>>1, pPrios[pCube->Lits[pArray[i]]>>1] );
    Abc_Print( 1, "\n" );
*/
    return pArray;
}